

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int tidySaveString(TidyDoc tdoc,tmbstr buffer,uint *buflen)

{
  uint nl;
  int iVar1;
  StreamOut *out;
  int iVar2;
  TidyBuffer outbuf;
  TidyBuffer local_50;
  
  nl = tdoc[0x8e]._opaque;
  iVar2 = tdoc[0x94]._opaque;
  tidyBufInitWithAllocator(&local_50,*(TidyAllocator **)(tdoc + 0xd18));
  out = prvTidyBufferOutput((TidyDocImpl *)tdoc,&local_50,iVar2,nl);
  iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
  iVar2 = -0xc;
  if (local_50.size <= *buflen) {
    memcpy(buffer,local_50.bp,(ulong)local_50.size);
    iVar2 = iVar1;
  }
  *buflen = local_50.size;
  tidyBufFree(&local_50);
  (**(code **)(**(long **)(tdoc + 0xd18) + 0x10))(*(long **)(tdoc + 0xd18),out);
  return iVar2;
}

Assistant:

int TIDY_CALL        tidySaveString( TidyDoc tdoc, tmbstr buffer, uint* buflen )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveString( doc, buffer, buflen );
}